

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O3

SimpleString __thiscall UtestShell::getFormattedName(UtestShell *this)

{
  size_t extraout_RDX;
  long *in_RSI;
  SimpleString SVar1;
  
  (**(code **)(*in_RSI + 0x140))();
  SimpleString::operator+=((SimpleString *)this,"(");
  SimpleString::operator+=((SimpleString *)this,(char *)in_RSI[1]);
  SimpleString::operator+=((SimpleString *)this,", ");
  SimpleString::operator+=((SimpleString *)this,(char *)in_RSI[2]);
  SimpleString::operator+=((SimpleString *)this,")");
  SVar1.bufferSize_ = extraout_RDX;
  SVar1.buffer_ = (char *)this;
  return SVar1;
}

Assistant:

SimpleString UtestShell::getFormattedName() const
{
    SimpleString formattedName(getMacroName());
    formattedName += "(";
    formattedName += group_;
    formattedName += ", ";
    formattedName += name_;
    formattedName += ")";

    return formattedName;
}